

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O2

bool adiak::internal::
     set_tuple_type<std::tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_2UL>
     ::setvalue(tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                *c,adiak_value_t *values,adiak_datatype_t *dtype)

{
  bool bVar1;
  
  bVar1 = set_tuple_type<std::tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_1UL>
          ::setvalue(c,values,dtype);
  if (bVar1) {
    bVar1 = create_container_type<std::vector<double,_std::allocator<double>_>_>::make_value
                      (&(c->
                        super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                        ).
                        super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                        .super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
                        _M_head_impl,values + 1,dtype->subtype[1]);
    return bVar1;
  }
  return false;
}

Assistant:

static bool setvalue(T &c, adiak_value_t *values, adiak_datatype_t *dtype) {
            bool result = set_tuple_type<T, I-1>::setvalue(c, values, dtype);
            if (!result)
               return false;
            return parse<typename std::tuple_element<I-1, T>::type>::make_value(std::get<I-1>(c), values+I-1, dtype->subtype[I-1]);
         }